

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nw_striped_avx2_256_64.c
# Opt level: O2

parasail_result_t *
parasail_nw_striped_profile_avx2_256_64
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  undefined8 *puVar1;
  __m256i alVar2;
  void *pvVar3;
  parasail_matrix_t *ppVar4;
  __m256i a;
  __m256i a_00;
  __m256i a_01;
  __m256i a_02;
  __m256i a_03;
  __m256i a_04;
  __m256i a_05;
  __m256i a_06;
  __m256i a_07;
  __m256i a_08;
  __m256i b;
  __m256i b_00;
  __m256i b_01;
  __m256i b_02;
  __m256i b_03;
  __m256i b_04;
  __m256i b_05;
  __m256i b_06;
  __m256i b_07;
  __m256i b_08;
  __m256i b_09;
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  int iVar12;
  int iVar13;
  int iVar14;
  parasail_result_t *ppVar15;
  __m256i *palVar16;
  __m256i *ptr;
  int64_t *ptr_00;
  undefined8 uVar17;
  __m256i *palVar18;
  ulong uVar19;
  long lVar20;
  long lVar21;
  ulong uVar22;
  char *pcVar23;
  ulong uVar24;
  uint uVar25;
  char *__format;
  __m256i *__return_storage_ptr__;
  long lVar26;
  long lVar27;
  long lVar28;
  __m256i *palVar29;
  int iVar30;
  ulong uVar31;
  long lVar32;
  int iVar33;
  uint uVar34;
  undefined1 auVar35 [16];
  undefined8 uVar37;
  undefined8 uVar38;
  undefined1 auVar36 [32];
  undefined8 uVar39;
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  __m256i_64_t e;
  __m256i_64_t h;
  undefined1 in_stack_fffffffffffffda0 [24];
  __m256i *palVar42;
  long local_1a0;
  long lStack_198;
  long lStack_190;
  long lStack_188;
  long lStack_178;
  long lStack_170;
  long lStack_168;
  longlong local_a0 [4];
  longlong local_80 [10];
  
  if (profile == (parasail_profile_t *)0x0) {
    __format = "%s: missing %s\n";
    pcVar23 = "profile";
  }
  else {
    pvVar3 = (profile->profile64).score;
    if (pvVar3 == (void *)0x0) {
      __format = "%s: missing %s\n";
      pcVar23 = "profile->profile64.score";
    }
    else {
      ppVar4 = profile->matrix;
      if (ppVar4 == (parasail_matrix_t *)0x0) {
        __format = "%s: missing %s\n";
        pcVar23 = "profile->matrix";
      }
      else {
        uVar34 = profile->s1Len;
        if ((int)uVar34 < 1) {
          __format = "%s: %s must be > 0\n";
          pcVar23 = "profile->s1Len";
        }
        else if (s2 == (char *)0x0) {
          __format = "%s: missing %s\n";
          pcVar23 = "s2";
        }
        else if (s2Len < 1) {
          __format = "%s: %s must be > 0\n";
          pcVar23 = "s2Len";
        }
        else if (open < 0) {
          __format = "%s: %s must be >= 0\n";
          pcVar23 = "open";
        }
        else {
          if (-1 < gap) {
            uVar25 = uVar34 - 1;
            palVar18 = (__m256i *)((ulong)uVar34 + 3 >> 2);
            uVar22 = (ulong)uVar25 / (ulong)palVar18;
            uVar24 = (ulong)uVar25 % (ulong)palVar18;
            uVar19 = CONCAT44(0,open);
            iVar33 = -open;
            iVar14 = ppVar4->min;
            uVar31 = 0x8000000000000000 - (long)iVar14;
            if (iVar14 != iVar33 && SBORROW4(iVar14,iVar33) == iVar14 + open < 0) {
              uVar31 = uVar19 | 0x8000000000000000;
            }
            iVar14 = ppVar4->max;
            ppVar15 = parasail_result_new();
            if (ppVar15 != (parasail_result_t *)0x0) {
              uVar34 = (uint)uVar24;
              ppVar15->flag = ppVar15->flag | 0x4800801;
              palVar42 = palVar18;
              palVar16 = parasail_memalign___m256i(0x20,(size_t)palVar18);
              ptr = parasail_memalign___m256i(0x20,(size_t)palVar18);
              palVar18 = parasail_memalign___m256i(0x20,(size_t)palVar18);
              ptr_00 = parasail_memalign_int64_t(0x20,(ulong)(s2Len + 1));
              if ((ptr_00 != (int64_t *)0x0 && palVar18 != (__m256i *)0x0) &&
                  (ptr != (__m256i *)0x0 && palVar16 != (__m256i *)0x0)) {
                iVar12 = s2Len + -1;
                iVar13 = 3 - (int)uVar22;
                uVar22 = CONCAT44(0,gap);
                auVar36._8_4_ = gap;
                auVar36._0_8_ = uVar22;
                auVar36._12_4_ = 0;
                auVar36._16_4_ = gap;
                auVar36._20_4_ = 0;
                auVar36._24_4_ = gap;
                auVar36._28_4_ = 0;
                lVar32 = uVar31 + 1;
                lVar20 = 0x7ffffffffffffffe - (long)iVar14;
                lVar21 = (long)iVar33;
                lVar26 = lVar21;
                for (__return_storage_ptr__ = (__m256i *)0x0; __return_storage_ptr__ != palVar42;
                    __return_storage_ptr__ = (__m256i *)((long)*__return_storage_ptr__ + 1)) {
                  lVar27 = lVar26;
                  for (lVar28 = 0; lVar28 != 4; lVar28 = lVar28 + 1) {
                    local_80[lVar28] = lVar27;
                    local_a0[lVar28] = lVar27 - uVar19;
                    lVar27 = lVar27 - (long)palVar42 * uVar22;
                  }
                  palVar29 = palVar16 + (long)__return_storage_ptr__;
                  (*palVar29)[0] = local_80[0];
                  (*palVar29)[1] = local_80[1];
                  (*palVar29)[2] = local_80[2];
                  (*palVar29)[3] = local_80[3];
                  palVar29 = palVar18 + (long)__return_storage_ptr__;
                  (*palVar29)[0] = local_a0[0];
                  (*palVar29)[1] = local_a0[1];
                  (*palVar29)[2] = local_a0[2];
                  (*palVar29)[3] = local_a0[3];
                  lVar26 = lVar26 - uVar22;
                }
                *ptr_00 = 0;
                for (uVar24 = 1; s2Len + 1 != uVar24; uVar24 = uVar24 + 1) {
                  ptr_00[uVar24] = lVar21;
                  lVar21 = lVar21 - uVar22;
                }
                iVar14 = (int)palVar42;
                lVar26 = (long)palVar42 * 0x20;
                lVar27 = lVar26 + 0x20;
                uVar22 = 0;
                local_1a0 = lVar20;
                lStack_198 = lVar20;
                lStack_190 = lVar20;
                lStack_188 = lVar20;
                lStack_178 = lVar32;
                lStack_170 = lVar32;
                lStack_168 = lVar32;
                lVar21 = lVar32;
                do {
                  palVar29 = palVar16;
                  if (uVar22 == (uint)s2Len) {
                    alVar2 = palVar29[uVar34];
                    for (iVar14 = 0; iVar14 < iVar13; iVar14 = iVar14 + 1) {
                      auVar36 = vperm2i128_avx2((undefined1  [32])alVar2,(undefined1  [32])alVar2,8)
                      ;
                      alVar2 = (__m256i)vpalignr_avx2((undefined1  [32])alVar2,auVar36,8);
                    }
                    auVar8._8_8_ = lVar32;
                    auVar8._0_8_ = lVar32;
                    auVar8._16_8_ = lVar32;
                    auVar8._24_8_ = lVar32;
                    auVar6._8_8_ = lStack_198;
                    auVar6._0_8_ = local_1a0;
                    auVar6._16_8_ = lStack_190;
                    auVar6._24_8_ = lStack_188;
                    auVar36 = vpcmpgtq_avx2(auVar8,auVar6);
                    auVar7._8_8_ = lStack_178;
                    auVar7._0_8_ = lVar21;
                    auVar7._16_8_ = lStack_170;
                    auVar7._24_8_ = lStack_168;
                    auVar9._8_8_ = lVar20;
                    auVar9._0_8_ = lVar20;
                    auVar9._16_8_ = lVar20;
                    auVar9._24_8_ = lVar20;
                    auVar40 = vpcmpgtq_avx2(auVar7,auVar9);
                    auVar36 = vpor_avx2(auVar40,auVar36);
                    if ((((auVar36 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         SUB321(auVar36 >> 0x7f,0) == '\0') && SUB321(auVar36 >> 0xbf,0) == '\0') &&
                        -1 < auVar36[0x1f]) {
                      uVar17 = vpextrq_avx(alVar2._16_16_,1);
                      iVar14 = (int)uVar17;
                    }
                    else {
                      *(byte *)&ppVar15->flag = (byte)ppVar15->flag | 0x40;
                      iVar14 = 0;
                      iVar12 = 0;
                      uVar25 = 0;
                    }
                    ppVar15->score = iVar14;
                    ppVar15->end_query = uVar25;
                    ppVar15->end_ref = iVar12;
                    parasail_free(ptr_00);
                    parasail_free(palVar18);
                    parasail_free(ptr);
                    parasail_free(palVar29);
                    return ppVar15;
                  }
                  alVar2 = palVar29[iVar14 - 1];
                  auVar35 = alVar2._0_16_;
                  auVar40._0_16_ = ZEXT116(0) * auVar35 + ZEXT116(1) * auVar35;
                  auVar40._16_16_ = ZEXT116(0) * alVar2._16_16_ + ZEXT116(1) * auVar35;
                  auVar40 = vpalignr_avx2((undefined1  [32])alVar2,auVar40,8);
                  iVar33 = ppVar4->mapper[(byte)s2[uVar22]];
                  iVar30 = (int)palVar42;
                  auVar40 = vpblendd_avx2(auVar40,ZEXT832((ulong)ptr_00[uVar22]),3);
                  lVar28 = 0;
                  auVar41._8_8_ = lVar32;
                  auVar41._0_8_ = lVar32;
                  auVar41._16_8_ = lVar32;
                  auVar41._24_8_ = lVar32;
                  while( true ) {
                    if (lVar26 == lVar28) break;
                    auVar40 = vpaddq_avx2(auVar40,*(undefined1 (*) [32])
                                                   ((long)pvVar3 +
                                                   lVar28 + (long)(iVar33 * iVar30) * 0x20));
                    auVar5 = *(undefined1 (*) [32])((long)*palVar18 + lVar28);
                    a[3] = (longlong)ptr_00;
                    a[0] = in_stack_fffffffffffffda0._0_8_;
                    a[1] = in_stack_fffffffffffffda0._8_8_;
                    a[2] = in_stack_fffffffffffffda0._16_8_;
                    b[1]._0_4_ = (int)lVar26;
                    b[0] = (longlong)palVar42;
                    b[1]._4_4_ = (int)((ulong)lVar26 >> 0x20);
                    b[2]._0_4_ = iVar13;
                    b[2]._4_4_ = iVar12;
                    b[3]._0_4_ = uVar34;
                    b[3]._4_4_ = uVar25;
                    _mm256_max_epi64_rpl(__return_storage_ptr__,a,b);
                    a_00[3] = (longlong)ptr_00;
                    a_00[0] = in_stack_fffffffffffffda0._0_8_;
                    a_00[1] = in_stack_fffffffffffffda0._8_8_;
                    a_00[2] = in_stack_fffffffffffffda0._16_8_;
                    b_00[1]._0_4_ = (int)lVar26;
                    b_00[0] = (longlong)palVar42;
                    b_00[1]._4_4_ = (int)((ulong)lVar26 >> 0x20);
                    b_00[2]._0_4_ = iVar13;
                    b_00[2]._4_4_ = iVar12;
                    b_00[3]._0_4_ = uVar34;
                    b_00[3]._4_4_ = uVar25;
                    _mm256_max_epi64_rpl(__return_storage_ptr__,a_00,b_00);
                    *(undefined1 (*) [32])((long)*ptr + lVar28) = auVar40;
                    a_01[3] = (longlong)ptr_00;
                    a_01[0] = in_stack_fffffffffffffda0._0_8_;
                    a_01[1] = in_stack_fffffffffffffda0._8_8_;
                    a_01[2] = in_stack_fffffffffffffda0._16_8_;
                    b_01[1]._0_4_ = (int)lVar26;
                    b_01[0] = (longlong)palVar42;
                    b_01[1]._4_4_ = (int)((ulong)lVar26 >> 0x20);
                    b_01[2]._0_4_ = iVar13;
                    b_01[2]._4_4_ = iVar12;
                    b_01[3]._0_4_ = uVar34;
                    b_01[3]._4_4_ = uVar25;
                    _mm256_max_epi64_rpl(__return_storage_ptr__,a_01,b_01);
                    a_02[3] = (longlong)ptr_00;
                    a_02[0] = in_stack_fffffffffffffda0._0_8_;
                    a_02[1] = in_stack_fffffffffffffda0._8_8_;
                    a_02[2] = in_stack_fffffffffffffda0._16_8_;
                    b_02[1]._0_4_ = (int)lVar26;
                    b_02[0] = (longlong)palVar42;
                    b_02[1]._4_4_ = (int)((ulong)lVar26 >> 0x20);
                    b_02[2]._0_4_ = iVar13;
                    b_02[2]._4_4_ = iVar12;
                    b_02[3]._0_4_ = uVar34;
                    b_02[3]._4_4_ = uVar25;
                    _mm256_min_epi64_rpl(__return_storage_ptr__,a_02,b_02);
                    a_03[3] = (longlong)ptr_00;
                    a_03[0] = in_stack_fffffffffffffda0._0_8_;
                    a_03[1] = in_stack_fffffffffffffda0._8_8_;
                    a_03[2] = in_stack_fffffffffffffda0._16_8_;
                    b_03[1]._0_4_ = (int)lVar26;
                    b_03[0] = (longlong)palVar42;
                    b_03[1]._4_4_ = (int)((ulong)lVar26 >> 0x20);
                    b_03[2]._0_4_ = iVar13;
                    b_03[2]._4_4_ = iVar12;
                    b_03[3]._0_4_ = uVar34;
                    b_03[3]._4_4_ = uVar25;
                    _mm256_min_epi64_rpl(__return_storage_ptr__,a_03,b_03);
                    a_04[3] = (longlong)ptr_00;
                    a_04[0] = in_stack_fffffffffffffda0._0_8_;
                    a_04[1] = in_stack_fffffffffffffda0._8_8_;
                    a_04[2] = in_stack_fffffffffffffda0._16_8_;
                    b_04[1]._0_4_ = (int)lVar26;
                    b_04[0] = (longlong)palVar42;
                    b_04[1]._4_4_ = (int)((ulong)lVar26 >> 0x20);
                    b_04[2]._0_4_ = iVar13;
                    b_04[2]._4_4_ = iVar12;
                    b_04[3]._0_4_ = uVar34;
                    b_04[3]._4_4_ = uVar25;
                    _mm256_min_epi64_rpl(__return_storage_ptr__,a_04,b_04);
                    auVar10._8_4_ = open;
                    auVar10._0_8_ = uVar19;
                    auVar10._12_4_ = 0;
                    auVar10._16_4_ = open;
                    auVar10._20_4_ = 0;
                    auVar10._24_4_ = open;
                    auVar10._28_4_ = 0;
                    vpsubq_avx2(auVar40,auVar10);
                    auVar40 = vpsubq_avx2(auVar5,auVar36);
                    a_05[3] = (longlong)ptr_00;
                    a_05[0] = in_stack_fffffffffffffda0._0_8_;
                    a_05[1] = in_stack_fffffffffffffda0._8_8_;
                    a_05[2] = in_stack_fffffffffffffda0._16_8_;
                    b_05[1]._0_4_ = (int)lVar26;
                    b_05[0] = (longlong)palVar42;
                    b_05[1]._4_4_ = (int)((ulong)lVar26 >> 0x20);
                    b_05[2]._0_4_ = iVar13;
                    b_05[2]._4_4_ = iVar12;
                    b_05[3]._0_4_ = uVar34;
                    b_05[3]._4_4_ = uVar25;
                    _mm256_max_epi64_rpl(__return_storage_ptr__,a_05,b_05);
                    *(undefined1 (*) [32])((long)*palVar18 + lVar28) = auVar40;
                    auVar41 = vpsubq_avx2(auVar41,auVar36);
                    a_06[3] = (longlong)ptr_00;
                    a_06[0] = in_stack_fffffffffffffda0._0_8_;
                    a_06[1] = in_stack_fffffffffffffda0._8_8_;
                    a_06[2] = in_stack_fffffffffffffda0._16_8_;
                    b_06[1]._0_4_ = (int)lVar26;
                    b_06[0] = (longlong)palVar42;
                    b_06[1]._4_4_ = (int)((ulong)lVar26 >> 0x20);
                    b_06[2]._0_4_ = iVar13;
                    b_06[2]._4_4_ = iVar12;
                    b_06[3]._0_4_ = uVar34;
                    b_06[3]._4_4_ = uVar25;
                    _mm256_max_epi64_rpl(__return_storage_ptr__,a_06,b_06);
                    auVar40 = *(undefined1 (*) [32])((long)*palVar29 + lVar28);
                    lVar28 = lVar28 + 0x20;
                  }
                  for (iVar33 = 0; iVar33 != 4; iVar33 = iVar33 + 1) {
                    auVar40 = vpermq_avx2(auVar41,0x90);
                    auVar41 = vpblendd_avx2(auVar40,ZEXT832(ptr_00[uVar22 + 1] - uVar19),3);
                    lVar28 = 0;
                    while( true ) {
                      if (lVar27 == lVar28 + 0x20) break;
                      puVar1 = (undefined8 *)((long)*ptr + lVar28);
                      uVar17 = *puVar1;
                      uVar37 = puVar1[1];
                      uVar38 = puVar1[2];
                      uVar39 = puVar1[3];
                      alVar2[3] = (longlong)ptr_00;
                      alVar2[0] = in_stack_fffffffffffffda0._0_8_;
                      alVar2[1] = in_stack_fffffffffffffda0._8_8_;
                      alVar2[2] = in_stack_fffffffffffffda0._16_8_;
                      b_07[1]._0_4_ = (int)lVar26;
                      b_07[0] = (longlong)palVar42;
                      b_07[1]._4_4_ = (int)((ulong)lVar26 >> 0x20);
                      b_07[2]._0_4_ = iVar13;
                      b_07[2]._4_4_ = iVar12;
                      b_07[3]._0_4_ = uVar34;
                      b_07[3]._4_4_ = uVar25;
                      _mm256_max_epi64_rpl(__return_storage_ptr__,alVar2,b_07);
                      puVar1 = (undefined8 *)((long)*ptr + lVar28);
                      *puVar1 = uVar17;
                      puVar1[1] = uVar37;
                      puVar1[2] = uVar38;
                      puVar1[3] = uVar39;
                      a_07[3] = (longlong)ptr_00;
                      a_07[0] = in_stack_fffffffffffffda0._0_8_;
                      a_07[1] = in_stack_fffffffffffffda0._8_8_;
                      a_07[2] = in_stack_fffffffffffffda0._16_8_;
                      b_08[1]._0_4_ = (int)lVar26;
                      b_08[0] = (longlong)palVar42;
                      b_08[1]._4_4_ = (int)((ulong)lVar26 >> 0x20);
                      b_08[2]._0_4_ = iVar13;
                      b_08[2]._4_4_ = iVar12;
                      b_08[3]._0_4_ = uVar34;
                      b_08[3]._4_4_ = uVar25;
                      _mm256_min_epi64_rpl(__return_storage_ptr__,a_07,b_08);
                      a_08[3] = (longlong)ptr_00;
                      a_08[0] = in_stack_fffffffffffffda0._0_8_;
                      a_08[1] = in_stack_fffffffffffffda0._8_8_;
                      a_08[2] = in_stack_fffffffffffffda0._16_8_;
                      b_09[1]._0_4_ = (int)lVar26;
                      b_09[0] = (longlong)palVar42;
                      b_09[1]._4_4_ = (int)((ulong)lVar26 >> 0x20);
                      b_09[2]._0_4_ = iVar13;
                      b_09[2]._4_4_ = iVar12;
                      b_09[3]._0_4_ = uVar34;
                      b_09[3]._4_4_ = uVar25;
                      _mm256_max_epi64_rpl(__return_storage_ptr__,a_08,b_09);
                      auVar5._8_8_ = uVar37;
                      auVar5._0_8_ = uVar17;
                      auVar5._16_8_ = uVar38;
                      auVar5._24_8_ = uVar39;
                      auVar11._8_4_ = open;
                      auVar11._0_8_ = uVar19;
                      auVar11._12_4_ = 0;
                      auVar11._16_4_ = open;
                      auVar11._20_4_ = 0;
                      auVar11._24_4_ = open;
                      auVar11._28_4_ = 0;
                      auVar40 = vpsubq_avx2(auVar5,auVar11);
                      auVar41 = vpsubq_avx2(auVar41,auVar36);
                      auVar40 = vpcmpgtq_avx2(auVar41,auVar40);
                      lVar28 = lVar28 + 0x20;
                      if ((((auVar40 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                           SUB321(auVar40 >> 0x7f,0) == '\0') && SUB321(auVar40 >> 0xbf,0) == '\0')
                          && -1 < auVar40[0x1f]) goto LAB_00718279;
                    }
                  }
LAB_00718279:
                  uVar22 = uVar22 + 1;
                  palVar16 = ptr;
                  ptr = palVar29;
                } while( true );
              }
            }
            return (parasail_result_t *)0x0;
          }
          __format = "%s: %s must be >= 0\n";
          pcVar23 = "gap";
        }
      }
    }
  }
  fprintf(_stderr,__format,"parasail_nw_striped_profile_avx2_256_64",pcVar23);
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int s1Len = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    int32_t offset = 0;
    int32_t position = 0;
    __m256i* restrict vProfile = NULL;
    __m256i* restrict pvHStore = NULL;
    __m256i* restrict pvHLoad = NULL;
    __m256i* restrict pvE = NULL;
    int64_t* restrict boundary = NULL;
    __m256i vGapO;
    __m256i vGapE;
    int64_t NEG_LIMIT = 0;
    int64_t POS_LIMIT = 0;
    int64_t score = 0;
    __m256i vNegLimit;
    __m256i vPosLimit;
    __m256i vSaturationCheckMin;
    __m256i vSaturationCheckMax;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile64.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    s1Len = profile->s1Len;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    matrix = profile->matrix;
    segWidth = 4; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
    vProfile = (__m256i*)profile->profile64.score;
    vGapO = _mm256_set1_epi64x_rpl(open);
    vGapE = _mm256_set1_epi64x_rpl(gap);
    NEG_LIMIT = (-open < matrix->min ? INT64_MIN + open : INT64_MIN - matrix->min) + 1;
    POS_LIMIT = INT64_MAX - matrix->max - 1;
    score = NEG_LIMIT;
    vNegLimit = _mm256_set1_epi64x_rpl(NEG_LIMIT);
    vPosLimit = _mm256_set1_epi64x_rpl(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(segLen*segWidth, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_NW | PARASAIL_FLAG_STRIPED
        | PARASAIL_FLAG_BITS_64 | PARASAIL_FLAG_LANES_4;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvHStore = parasail_memalign___m256i(32, segLen);
    pvHLoad  = parasail_memalign___m256i(32, segLen);
    pvE      = parasail_memalign___m256i(32, segLen);
    boundary = parasail_memalign_int64_t(32, s2Len+1);

    /* validate heap variables */
    if (!pvHStore) return NULL;
    if (!pvHLoad) return NULL;
    if (!pvE) return NULL;
    if (!boundary) return NULL;

    /* initialize H and E */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            int32_t segNum = 0;
            __m256i_64_t h;
            __m256i_64_t e;
            for (segNum=0; segNum<segWidth; ++segNum) {
                int64_t tmp = -open-gap*(segNum*segLen+i);
                h.v[segNum] = tmp < INT64_MIN ? INT64_MIN : tmp;
                tmp = tmp - open;
                e.v[segNum] = tmp < INT64_MIN ? INT64_MIN : tmp;
            }
            _mm256_store_si256(&pvHStore[index], h.m);
            _mm256_store_si256(&pvE[index], e.m);
            ++index;
        }
    }

    /* initialize uppder boundary */
    {
        boundary[0] = 0;
        for (i=1; i<=s2Len; ++i) {
            int64_t tmp = -open-gap*(i-1);
            boundary[i] = tmp < INT64_MIN ? INT64_MIN : tmp;
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m256i vE;
        /* Initialize F value to -inf.  Any errors to vH values will be
         * corrected in the Lazy_F loop.  */
        __m256i vF = vNegLimit;

        /* load final segment of pvHStore and shift left by 2 bytes */
        __m256i vH = _mm256_slli_si256_rpl(pvHStore[segLen - 1], 8);

        /* Correct part of the vProfile */
        const __m256i* vP = vProfile + matrix->mapper[(unsigned char)s2[j]] * segLen;

        /* Swap the 2 H buffers. */
        __m256i* pv = pvHLoad;
        pvHLoad = pvHStore;
        pvHStore = pv;

        /* insert upper boundary condition */
        vH = _mm256_insert_epi64_rpl(vH, boundary[j], 0);

        /* inner loop to process the query sequence */
        for (i=0; i<segLen; ++i) {
            vH = _mm256_add_epi64(vH, _mm256_load_si256(vP + i));
            vE = _mm256_load_si256(pvE + i);

            /* Get max from vH, vE and vF. */
            vH = _mm256_max_epi64_rpl(vH, vE);
            vH = _mm256_max_epi64_rpl(vH, vF);
            /* Save vH values. */
            _mm256_store_si256(pvHStore + i, vH);
            vSaturationCheckMax = _mm256_max_epi64_rpl(vSaturationCheckMax, vH);
            vSaturationCheckMin = _mm256_min_epi64_rpl(vSaturationCheckMin, vH);
            vSaturationCheckMin = _mm256_min_epi64_rpl(vSaturationCheckMin, vE);
            vSaturationCheckMin = _mm256_min_epi64_rpl(vSaturationCheckMin, vF);
#ifdef PARASAIL_TABLE
            arr_store_si256(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif

            /* Update vE value. */
            vH = _mm256_sub_epi64(vH, vGapO);
            vE = _mm256_sub_epi64(vE, vGapE);
            vE = _mm256_max_epi64_rpl(vE, vH);
            _mm256_store_si256(pvE + i, vE);

            /* Update vF value. */
            vF = _mm256_sub_epi64(vF, vGapE);
            vF = _mm256_max_epi64_rpl(vF, vH);

            /* Load the next vH. */
            vH = _mm256_load_si256(pvHLoad + i);
        }

        /* Lazy_F loop: has been revised to disallow adjecent insertion and
         * then deletion, so don't update E(i, i), learn from SWPS3 */
        for (k=0; k<segWidth; ++k) {
            int64_t tmp = boundary[j+1]-open;
            int64_t tmp2 = tmp < INT64_MIN ? INT64_MIN : tmp;
            vF = _mm256_slli_si256_rpl(vF, 8);
            vF = _mm256_insert_epi64_rpl(vF, tmp2, 0);
            for (i=0; i<segLen; ++i) {
                vH = _mm256_load_si256(pvHStore + i);
                vH = _mm256_max_epi64_rpl(vH,vF);
                _mm256_store_si256(pvHStore + i, vH);
                vSaturationCheckMin = _mm256_min_epi64_rpl(vSaturationCheckMin, vH);
                vSaturationCheckMax = _mm256_max_epi64_rpl(vSaturationCheckMax, vH);
#ifdef PARASAIL_TABLE
                arr_store_si256(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif
                vH = _mm256_sub_epi64(vH, vGapO);
                vF = _mm256_sub_epi64(vF, vGapE);
                if (! _mm256_movemask_epi8(_mm256_cmpgt_epi64(vF, vH))) goto end;
                /*vF = _mm256_max_epi64_rpl(vF, vH);*/
            }
        }
end:
        {
        }

#ifdef PARASAIL_ROWCOL
        /* extract last value from the column */
        {
            vH = _mm256_load_si256(pvHStore + offset);
            for (k=0; k<position; ++k) {
                vH = _mm256_slli_si256_rpl(vH, 8);
            }
            result->rowcols->score_row[j] = (int64_t) _mm256_extract_epi64_rpl (vH, 3);
        }
#endif
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m256i vH = _mm256_load_si256(pvHStore+i);
        arr_store_col(result->rowcols->score_col, vH, i, segLen);
    }
#endif

    /* extract last value from the last column */
    {
        __m256i vH = _mm256_load_si256(pvHStore + offset);
        for (k=0; k<position; ++k) {
            vH = _mm256_slli_si256_rpl (vH, 8);
        }
        score = (int64_t) _mm256_extract_epi64_rpl (vH, 3);
    }

    if (_mm256_movemask_epi8(_mm256_or_si256(
            _mm256_cmplt_epi64_rpl(vSaturationCheckMin, vNegLimit),
            _mm256_cmpgt_epi64(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(boundary);
    parasail_free(pvE);
    parasail_free(pvHLoad);
    parasail_free(pvHStore);

    return result;
}